

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

uint8_t * decode_tiles_mt(AV1Decoder *pbi,uint8_t *data,uint8_t *data_end,int start_tile,
                         int end_tile)

{
  int iVar1;
  int iVar2;
  int tile_cols_00;
  void *pvVar3;
  int in_ECX;
  AV1Decoder *in_RSI;
  long in_RDI;
  int in_R8D;
  TileDataDec *tile_data;
  TileDataDec *tile_data_1;
  int col;
  int row;
  uint8_t *raw_data_end;
  int num_workers;
  int tile_count_tg;
  int tile_cols_end;
  int tile_cols_start;
  int tile_rows_end;
  int tile_rows_start;
  int single_col;
  int dec_tile_col;
  int single_row;
  int dec_tile_row;
  TileBufferDec (*tile_buffers) [64];
  int n_tiles;
  int tile_rows;
  int tile_cols;
  CommonTileParams *tiles;
  AV1_COMMON *cm;
  TileBufferDec (*in_stack_000001e8) [64];
  uint8_t *in_stack_000001f0;
  uint8_t *in_stack_000001f8;
  AV1Decoder *in_stack_00000200;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int end_tile_00;
  int start_tile_00;
  TileBufferDec (*in_stack_ffffffffffffff68) [64];
  uint8_t *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int iVar4;
  undefined4 in_stack_ffffffffffffff7c;
  int iVar5;
  AV1Decoder *pbi_00;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  long lVar6;
  
  iVar1 = *(int *)(in_RDI + 0x9c00);
  iVar2 = *(int *)(in_RDI + 0x9c04);
  start_tile_00 = iVar2;
  if (*(int *)(in_RDI + 0x58da0) < iVar2) {
    start_tile_00 = *(int *)(in_RDI + 0x58da0);
  }
  end_tile_00 = iVar1;
  if (*(int *)(in_RDI + 0x58da4) < iVar1) {
    end_tile_00 = *(int *)(in_RDI + 0x58da4);
  }
  pbi_00 = (AV1Decoder *)0x0;
  local_70 = iVar1;
  if (*(int *)(in_RDI + 0x9e44) == 0) {
    local_64 = 0;
    local_6c = 0;
    local_68 = iVar2;
  }
  else {
    if (*(int *)(in_RDI + 0x58da0) < 0) {
      in_stack_ffffffffffffff5c = 0;
      in_stack_ffffffffffffff58 = iVar2;
    }
    else {
      in_stack_ffffffffffffff58 = start_tile_00 + 1;
      in_stack_ffffffffffffff5c = start_tile_00;
    }
    local_68 = in_stack_ffffffffffffff58;
    local_64 = in_stack_ffffffffffffff5c;
    if (*(int *)(in_RDI + 0x58da4) < 0) {
      in_stack_ffffffffffffff54 = 0;
      in_stack_ffffffffffffff50 = iVar1;
      local_6c = in_stack_ffffffffffffff54;
    }
    else {
      in_stack_ffffffffffffff50 = end_tile_00 + 1;
      in_stack_ffffffffffffff54 = end_tile_00;
      local_70 = end_tile_00 + 1;
      local_6c = end_tile_00;
    }
  }
  tile_cols_00 = (in_R8D - in_ECX) + 1;
  if (*(int *)(in_RDI + 0x58d88) < tile_cols_00) {
    tile_cols_00 = *(int *)(in_RDI + 0x58d88);
  }
  if ((((local_64 < local_68) && (local_6c < local_70)) && (local_64 * iVar1 + local_6c <= in_R8D))
     && (in_ECX <= (local_68 + -1) * iVar1 + local_70 + -1)) {
    lVar6 = in_RDI;
    decode_mt_init((AV1Decoder *)CONCAT44(start_tile_00,end_tile_00));
    if (*(int *)(in_RDI + 0x9e44) == 0) {
      get_tile_buffers(pbi_00,(uint8_t *)
                              CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,start_tile_00,end_tile_00
                      );
    }
    else {
      pbi_00 = (AV1Decoder *)
               get_ls_tile_buffers(in_stack_00000200,in_stack_000001f8,in_stack_000001f0,
                                   in_stack_000001e8);
    }
    if ((*(long *)(lVar6 + 0x48d20) == 0) || (iVar1 * iVar2 != *(int *)(lVar6 + 0x48d28))) {
      decoder_alloc_tile_data
                ((AV1Decoder *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c);
    }
    if (*(long *)(lVar6 + 0x2a10) == 0) {
      pvVar3 = aom_memalign(CONCAT44(tile_cols_00,in_stack_ffffffffffffff48),
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      *(void **)(lVar6 + 0x2a10) = pvVar3;
      if (*(long *)(lVar6 + 0x2a10) == 0) {
        aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3b90),AOM_CODEC_MEM_ERROR,
                           "Failed to allocate pbi->dcb.xd.seg_mask");
      }
    }
    for (iVar5 = 0; iVar5 < iVar2; iVar5 = iVar5 + 1) {
      for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
        in_stack_ffffffffffffff70 =
             (uint8_t *)
             (*(long *)(lVar6 + 0x48d20) + (long)(iVar5 * *(int *)(in_RDI + 0x9c00)) * 0x53a0 +
             (long)iVar4 * 0x53a0);
        av1_tile_init((TileInfo *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      (AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),0,
                      0x1ab5a1);
      }
    }
    tile_mt_queue((AV1Decoder *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                  tile_cols_00,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                  in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,end_tile_00,
                  (int)in_stack_ffffffffffffff68,(int)in_stack_ffffffffffffff70);
    reset_dec_workers((AV1Decoder *)CONCAT44(start_tile_00,end_tile_00),
                      (AVxWorkerHook)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                      in_stack_ffffffffffffff54);
    launch_dec_workers((AV1Decoder *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (uint8_t *)CONCAT44(tile_cols_00,in_stack_ffffffffffffff48),
                       in_stack_ffffffffffffff44);
    sync_dec_workers((AV1Decoder *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     in_stack_ffffffffffffff3c);
    if (*(int *)(lVar6 + 0x3ad0) != 0) {
      aom_internal_error((aom_internal_error_info *)(lVar6 + 0x5ff08),AOM_CODEC_CORRUPT_FRAME,
                         "Failed to decode tile data");
    }
    if (*(int *)(in_RDI + 0x9e44) == 0) {
      in_RSI = (AV1Decoder *)
               aom_reader_find_end((aom_reader *)
                                   (*(long *)(lVar6 + 0x48d20) + (long)in_R8D * 0x53a0 + 0x18));
    }
    else {
      in_RSI = pbi_00;
      if (iVar1 * iVar2 == 1) {
        in_RSI = (AV1Decoder *)
                 aom_reader_find_end((aom_reader *)(*(long *)(lVar6 + 0x48d20) + 0x18));
      }
    }
  }
  return (uint8_t *)in_RSI;
}

Assistant:

static const uint8_t *decode_tiles_mt(AV1Decoder *pbi, const uint8_t *data,
                                      const uint8_t *data_end, int start_tile,
                                      int end_tile) {
  AV1_COMMON *const cm = &pbi->common;
  CommonTileParams *const tiles = &cm->tiles;
  const int tile_cols = tiles->cols;
  const int tile_rows = tiles->rows;
  const int n_tiles = tile_cols * tile_rows;
  TileBufferDec(*const tile_buffers)[MAX_TILE_COLS] = pbi->tile_buffers;
  const int dec_tile_row = AOMMIN(pbi->dec_tile_row, tile_rows);
  const int single_row = pbi->dec_tile_row >= 0;
  const int dec_tile_col = AOMMIN(pbi->dec_tile_col, tile_cols);
  const int single_col = pbi->dec_tile_col >= 0;
  int tile_rows_start;
  int tile_rows_end;
  int tile_cols_start;
  int tile_cols_end;
  int tile_count_tg;
  int num_workers;
  const uint8_t *raw_data_end = NULL;

  if (tiles->large_scale) {
    tile_rows_start = single_row ? dec_tile_row : 0;
    tile_rows_end = single_row ? dec_tile_row + 1 : tile_rows;
    tile_cols_start = single_col ? dec_tile_col : 0;
    tile_cols_end = single_col ? tile_cols_start + 1 : tile_cols;
  } else {
    tile_rows_start = 0;
    tile_rows_end = tile_rows;
    tile_cols_start = 0;
    tile_cols_end = tile_cols;
  }
  tile_count_tg = end_tile - start_tile + 1;
  num_workers = AOMMIN(pbi->max_threads, tile_count_tg);

  // No tiles to decode.
  if (tile_rows_end <= tile_rows_start || tile_cols_end <= tile_cols_start ||
      // First tile is larger than end_tile.
      tile_rows_start * tile_cols + tile_cols_start > end_tile ||
      // Last tile is smaller than start_tile.
      (tile_rows_end - 1) * tile_cols + tile_cols_end - 1 < start_tile)
    return data;

  assert(tile_rows <= MAX_TILE_ROWS);
  assert(tile_cols <= MAX_TILE_COLS);
  assert(tile_count_tg > 0);
  assert(num_workers > 0);
  assert(start_tile <= end_tile);
  assert(start_tile >= 0 && end_tile < n_tiles);

  decode_mt_init(pbi);

  // get tile size in tile group
#if EXT_TILE_DEBUG
  if (tiles->large_scale) assert(pbi->ext_tile_debug == 1);
  if (tiles->large_scale)
    raw_data_end = get_ls_tile_buffers(pbi, data, data_end, tile_buffers);
  else
#endif  // EXT_TILE_DEBUG
    get_tile_buffers(pbi, data, data_end, tile_buffers, start_tile, end_tile);

  if (pbi->tile_data == NULL || n_tiles != pbi->allocated_tiles) {
    decoder_alloc_tile_data(pbi, n_tiles);
  }
  if (pbi->dcb.xd.seg_mask == NULL)
    CHECK_MEM_ERROR(cm, pbi->dcb.xd.seg_mask,
                    (uint8_t *)aom_memalign(
                        16, 2 * MAX_SB_SQUARE * sizeof(*pbi->dcb.xd.seg_mask)));

  for (int row = 0; row < tile_rows; row++) {
    for (int col = 0; col < tile_cols; col++) {
      TileDataDec *tile_data = pbi->tile_data + row * tiles->cols + col;
      av1_tile_init(&tile_data->tile_info, cm, row, col);
    }
  }

  tile_mt_queue(pbi, tile_cols, tile_rows, tile_rows_start, tile_rows_end,
                tile_cols_start, tile_cols_end, start_tile, end_tile);

  reset_dec_workers(pbi, tile_worker_hook, num_workers);
  launch_dec_workers(pbi, data_end, num_workers);
  sync_dec_workers(pbi, num_workers);

  if (pbi->dcb.corrupted)
    aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                       "Failed to decode tile data");

  if (tiles->large_scale) {
    if (n_tiles == 1) {
      // Find the end of the single tile buffer
      return aom_reader_find_end(&pbi->tile_data->bit_reader);
    }
    // Return the end of the last tile buffer
    return raw_data_end;
  }
  TileDataDec *const tile_data = pbi->tile_data + end_tile;

  return aom_reader_find_end(&tile_data->bit_reader);
}